

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O1

void ssh2_bpp_free_incoming_crypto(ssh2_bpp_state *s)

{
  ssh2_mac *psVar1;
  ssh_cipher *psVar2;
  ssh_decompressor *psVar3;
  
  psVar1 = (s->in).mac;
  if (psVar1 != (ssh2_mac *)0x0) {
    (*psVar1->vt->free)(psVar1);
  }
  psVar2 = (s->in).cipher;
  if (psVar2 != (ssh_cipher *)0x0) {
    (*psVar2->vt->free)(psVar2);
  }
  psVar3 = s->in_decomp;
  if (psVar3 != (ssh_decompressor *)0x0) {
    (*psVar3->vt->decompress_free)(psVar3);
    return;
  }
  return;
}

Assistant:

static void ssh2_bpp_free_incoming_crypto(struct ssh2_bpp_state *s)
{
    /* As above, take care to free in.mac before in.cipher */
    if (s->in.mac)
        ssh2_mac_free(s->in.mac);
    if (s->in.cipher)
        ssh_cipher_free(s->in.cipher);
    if (s->in_decomp)
        ssh_decompressor_free(s->in_decomp);
}